

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Condition.cpp
# Opt level: O2

bool __thiscall
AI::Condition::isTrue
          (Condition *this,WorldState *state,Task *task,
          vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>
          *satisfiablePredicates,bool isMerged)

{
  bool *pbVar1;
  SatisfiablePredicateIdentifier SVar2;
  pointer pRVar3;
  pointer pRVar4;
  pointer pCVar5;
  pointer pSVar6;
  pointer pSVar7;
  Task *__args_1;
  vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_> *pvVar8;
  const_iterator cVar9;
  const_iterator cVar10;
  const_iterator cVar11;
  long lVar12;
  const_iterator cVar13;
  const_iterator cVar14;
  pointer pCVar15;
  long lVar16;
  pointer pSVar17;
  pointer pSVar18;
  RequiredValue *requiredValue;
  pointer __k;
  pointer __k_00;
  pointer pSVar19;
  bool bVar20;
  ConsumableFact consumable_2;
  ConsumableFact consumable_1;
  ConsumableFact consumable;
  Task *local_40;
  vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_> *local_38;
  
  pRVar3 = (this->requiredFlags).
           super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __k_00 = (this->requiredFlags).
           super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_40 = task;
  local_38 = satisfiablePredicates;
  while (__k_00 != pRVar3) {
    cVar9 = std::
            _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_bool>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_bool>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
            ::find((_Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_bool>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_bool>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                    *)state,&__k_00->id);
    if ((_Rb_tree_header *)cVar9._M_node ==
        &(state->current).flags._M_t._M_impl.super__Rb_tree_header) {
      log<char_const*,char_const*>("[Condition] ","ERROR: flag missing");
    }
    pbVar1 = &__k_00->flag;
    __k_00 = __k_00 + 1;
    if ((bool)cVar9._M_node[1].field_0x4 != *pbVar1) {
      return false;
    }
  }
  pRVar4 = (this->requiredValues).
           super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (__k = (this->requiredValues).
             super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
             super__Vector_impl_data._M_start; pvVar8 = local_38, __args_1 = local_40, __k != pRVar4
      ; __k = __k + 1) {
    cVar10 = std::
             _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_float>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_float>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
             ::find(&(state->current).values._M_t,&__k->id);
    if ((_Rb_tree_header *)cVar10._M_node ==
        &(state->current).values._M_t._M_impl.super__Rb_tree_header) {
      log<char_const*,char_const*>("[Condition] ","ERROR: flag missing");
    }
    switch(__k->op) {
    case LessThan:
      if (__k->value <= *(float *)&cVar10._M_node[1].field_0x4) {
        return false;
      }
      break;
    case LessEqual:
      if (__k->value <= *(float *)&cVar10._M_node[1].field_0x4 &&
          *(float *)&cVar10._M_node[1].field_0x4 != __k->value) {
        return false;
      }
      break;
    case EqualTo:
      if (*(float *)&cVar10._M_node[1].field_0x4 != __k->value) {
        return false;
      }
      if (NAN(*(float *)&cVar10._M_node[1].field_0x4) || NAN(__k->value)) {
        return false;
      }
      break;
    case NotEqualTo:
      if ((*(float *)&cVar10._M_node[1].field_0x4 == __k->value) &&
         (!NAN(*(float *)&cVar10._M_node[1].field_0x4) && !NAN(__k->value))) {
        return false;
      }
      break;
    case GreaterThan:
      if (*(float *)&cVar10._M_node[1].field_0x4 <= __k->value) {
        return false;
      }
      break;
    case GreaterEqual:
      if (*(float *)&cVar10._M_node[1].field_0x4 <= __k->value &&
          __k->value != *(float *)&cVar10._M_node[1].field_0x4) {
        return false;
      }
    }
  }
  if (isMerged) {
LAB_0012d9bd:
    pCVar15 = (this->consumableFlags).
              super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar5 = (this->consumableFlags).
             super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      if (pCVar15 == pCVar5) {
        pCVar15 = (this->consumableValues).
                  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pCVar5 = (this->consumableValues).
                 super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        do {
          if (pCVar15 == pCVar5) {
            pCVar15 = (this->consumableVectors).
                      super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pCVar5 = (this->consumableVectors).
                     super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            do {
              bVar20 = pCVar15 == pCVar5;
              if (bVar20) {
                return bVar20;
              }
              consumable_2 = *pCVar15;
              cVar14 = std::
                       _Rb_tree<ConsumableFact,_std::pair<const_ConsumableFact,_AI::FactVector>,_std::_Select1st<std::pair<const_ConsumableFact,_AI::FactVector>_>,_std::less<ConsumableFact>,_std::allocator<std::pair<const_ConsumableFact,_AI::FactVector>_>_>
                       ::find(&(state->facts).vectors._M_t,&consumable_2);
              pCVar15 = pCVar15 + 1;
            } while (*(char *)&cVar14._M_node[1]._M_left != '\x01');
            return bVar20;
          }
          consumable_1 = *pCVar15;
          cVar13 = std::
                   _Rb_tree<ConsumableFact,_std::pair<const_ConsumableFact,_AI::FactValue>,_std::_Select1st<std::pair<const_ConsumableFact,_AI::FactValue>_>,_std::less<ConsumableFact>,_std::allocator<std::pair<const_ConsumableFact,_AI::FactValue>_>_>
                   ::find(&(state->facts).values._M_t,&consumable_1);
          pCVar15 = pCVar15 + 1;
        } while (*(char *)&cVar13._M_node[1]._M_parent == '\0');
        return false;
      }
      consumable = *pCVar15;
      cVar11 = std::
               _Rb_tree<ConsumableFact,_std::pair<const_ConsumableFact,_AI::FactFlag>,_std::_Select1st<std::pair<const_ConsumableFact,_AI::FactFlag>_>,_std::less<ConsumableFact>,_std::allocator<std::pair<const_ConsumableFact,_AI::FactFlag>_>_>
               ::find((_Rb_tree<ConsumableFact,_std::pair<const_ConsumableFact,_AI::FactFlag>,_std::_Select1st<std::pair<const_ConsumableFact,_AI::FactFlag>_>,_std::less<ConsumableFact>,_std::allocator<std::pair<const_ConsumableFact,_AI::FactFlag>_>_>
                       *)&state->facts,&consumable);
      pCVar15 = pCVar15 + 1;
    } while (cVar11._M_node[1].field_0x5 == '\0');
  }
  else {
    pSVar19 = (this->satisfiedPredicates).
              super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar6 = (this->satisfiedPredicates).
             super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (pSVar19 == pSVar6) goto LAB_0012d9bd;
      SVar2 = pSVar19->identifier;
      pSVar18 = (pvVar8->
                super__Vector_base<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pSVar7 = (pvVar8->
               super__Vector_base<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar16 = (long)pSVar7 - (long)pSVar18;
      for (lVar12 = lVar16 / 0x28 >> 2; pSVar17 = pSVar18, 0 < lVar12; lVar12 = lVar12 + -1) {
        if (pSVar18->identifier == SVar2) goto LAB_0012dab1;
        if (pSVar18[1].identifier == SVar2) {
          pSVar17 = pSVar18 + 1;
          goto LAB_0012dab1;
        }
        if (pSVar18[2].identifier == SVar2) {
          pSVar17 = pSVar18 + 2;
          goto LAB_0012dab1;
        }
        if (pSVar18[3].identifier == SVar2) {
          pSVar17 = pSVar18 + 3;
          goto LAB_0012dab1;
        }
        pSVar18 = pSVar18 + 4;
        lVar16 = lVar16 + -0xa0;
      }
      lVar16 = lVar16 / 0x28;
      if (lVar16 == 1) {
LAB_0012da95:
        pSVar17 = pSVar7;
        if (pSVar18->identifier == SVar2) {
          pSVar17 = pSVar18;
        }
      }
      else if (lVar16 == 2) {
LAB_0012da8c:
        if (pSVar17->identifier != SVar2) {
          pSVar18 = pSVar17 + 1;
          goto LAB_0012da95;
        }
      }
      else {
        pSVar17 = pSVar7;
        if ((lVar16 == 3) && (pSVar17 = pSVar18, pSVar18->identifier != SVar2)) {
          pSVar17 = pSVar18 + 1;
          goto LAB_0012da8c;
        }
      }
LAB_0012dab1:
      bVar20 = std::function<bool_(const_AI::WorldState_&,_const_AI::Task_&,_int)>::operator()
                         (&pSVar17->func,state,__args_1,pSVar19->index);
      pSVar19 = pSVar19 + 1;
    } while (bVar20);
  }
  return false;
}

Assistant:

bool Condition::isTrue(const WorldState& state, const Task& task, const std::vector<SatisfiablePredicate>& satisfiablePredicates, bool isMerged)
	{
		for (auto& requiredFlag : requiredFlags)
		{
			auto it = state.current.flags.find(requiredFlag.id);

			if (it == end(state.current.flags))
			{
				log("[Condition] ", "ERROR: flag missing");
			}

			if (it->second != requiredFlag.flag)
				return false;
		}

		for (auto& requiredValue : requiredValues)
		{
			auto it = state.current.values.find(requiredValue.id);

			if (it == end(state.current.values))
			{
				log("[Condition] ", "ERROR: flag missing");
			}

			switch (requiredValue.op)
			{
				case ConditionOp::LessThan
					:
				{					
					if (it->second >= requiredValue.value)
						return false;

					break;
				}
				case ConditionOp::LessEqual
					:
				{					
					if (it->second > requiredValue.value)
						return false;

					break;
				}
				case ConditionOp::EqualTo
					:
				{					
					if (it->second != requiredValue.value)
						return false;
					break;
				}
				case ConditionOp::NotEqualTo
					:
				{
					if (it->second == requiredValue.value)
						return false;
					break;
				}
				case ConditionOp::GreaterThan
					:
				{					
					if (it->second <= requiredValue.value)
						return false;

					break;
				}
				case ConditionOp::GreaterEqual
					:
				{					
					if (it->second < requiredValue.value)
						return false;

					break;
				}				
			}
		}		

		if (!isMerged)
		{
			for (auto satisfiable : satisfiedPredicates)
			{			
				const auto& pred = std::find_if(begin(satisfiablePredicates), end(satisfiablePredicates), 
					[satisfiable](const auto& sp) {return sp.identifier == satisfiable.identifier;});
				
				if (!pred->func(state, task, satisfiable.index))
				{
					return false;
				}
			}
		}

		for (auto consumable : consumableFlags)
		{
			auto it = state.facts.flags.find(consumable);

			if (it->second.consumed)
			{
				return false;
			}
		}

		for (auto consumable : consumableValues)
		{
			auto it = state.facts.values.find(consumable);

			if (it->second.consumed)
			{
				return false;
			}
		}

		for (auto consumable : consumableVectors)
		{
			auto it = state.facts.vectors.find(consumable);

			if (it->second.consumed)
			{
				return false;
			}
		}

		return true;
	}